

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O3

MPP_RET jpege_proc_jpeg_cfg(MppEncJpegCfg *dst,MppEncJpegCfg *src,MppEncRcCfg *rc)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  RK_U8 *pRVar9;
  RK_S32 RVar10;
  undefined4 uVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  uint uVar15;
  int iVar16;
  RK_U32 RVar17;
  RK_U8 *pRVar18;
  RK_U8 *pRVar19;
  RK_U8 *pRVar20;
  RK_U8 *pRVar21;
  char *pcVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  MPP_RET MVar27;
  MppEncJpegCfg bak;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 uVar28;
  undefined4 uVar29;
  
  uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar1 = src->change;
  if (uVar1 == 0) {
    return MPP_OK;
  }
  RVar17 = dst->change;
  RVar12 = dst->quant;
  RVar13 = dst->q_factor;
  RVar14 = dst->qf_max;
  RVar10 = dst->qf_min;
  uVar11 = *(undefined4 *)&dst->field_0x14;
  pRVar18 = dst->qtable_y;
  pRVar21 = dst->qtable_u;
  pRVar9 = dst->qtable_v;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 2) == 0) goto LAB_001c723b;
      pRVar19 = src->qtable_u;
      if (src->qtable_y != (RK_U8 *)0x0) {
        if (pRVar19 == (RK_U8 *)0x0) {
          pRVar19 = (RK_U8 *)0x0;
        }
        else if (src->qtable_v != (RK_U8 *)0x0) {
          pRVar18 = dst->qtable_y;
          if (pRVar18 == (RK_U8 *)0x0) {
            pRVar18 = (RK_U8 *)mpp_osal_malloc("jpege_proc_jpeg_cfg",0x40);
            dst->qtable_y = pRVar18;
          }
          if (dst->qtable_u == (RK_U8 *)0x0) {
            pRVar21 = (RK_U8 *)mpp_osal_malloc("jpege_proc_jpeg_cfg",0x40);
            dst->qtable_u = pRVar21;
            pRVar18 = dst->qtable_y;
            if (pRVar18 == (RK_U8 *)0x0 || pRVar21 == (RK_U8 *)0x0) goto LAB_001c7330;
          }
          else if (pRVar18 == (RK_U8 *)0x0) {
LAB_001c7330:
            _mpp_log_l(2,"jpege_api_v2","qtable is null, malloc err\n","jpege_proc_jpeg_cfg");
            return MPP_ERR_MALLOC;
          }
          uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
          if (src->qtable_u != src->qtable_v) {
            lVar23 = 0;
LAB_001c6f6d:
            if (src->qtable_u[lVar23] == src->qtable_v[lVar23]) goto code_r0x001c6f7b;
            if ((jpege_debug & 0x10) != 0) {
              _mpp_log_l(4,"jpege_api_v2","qtable_u and qtable_v are different, use qtable_u\n",
                         (char *)0x0);
            }
            uVar26 = 0;
            RVar17 = jpege_debug;
            do {
              if ((RVar17 & 0x10) != 0) {
                in_stack_ffffffffffffff88 =
                     CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)uVar26);
                _mpp_log_l(4,"jpege_api_v2","qtable_u[%d] %d qtable_v[%d] %d\n",(char *)0x0,
                           uVar26 & 0xffffffff,(ulong)src->qtable_u[uVar26],
                           in_stack_ffffffffffffff88,(uint)src->qtable_v[uVar26]);
                RVar17 = jpege_debug;
              }
              uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
              uVar26 = uVar26 + 1;
            } while (uVar26 != 0x40);
            pRVar18 = dst->qtable_y;
          }
LAB_001c73e4:
          pRVar21 = src->qtable_y;
          uVar28 = *(undefined8 *)pRVar21;
          uVar3 = *(undefined8 *)(pRVar21 + 8);
          uVar4 = *(undefined8 *)(pRVar21 + 0x10);
          uVar5 = *(undefined8 *)(pRVar21 + 0x18);
          uVar6 = *(undefined8 *)(pRVar21 + 0x20);
          uVar7 = *(undefined8 *)(pRVar21 + 0x28);
          uVar8 = *(undefined8 *)(pRVar21 + 0x38);
          *(undefined8 *)(pRVar18 + 0x30) = *(undefined8 *)(pRVar21 + 0x30);
          *(undefined8 *)(pRVar18 + 0x38) = uVar8;
          *(undefined8 *)(pRVar18 + 0x20) = uVar6;
          *(undefined8 *)(pRVar18 + 0x28) = uVar7;
          *(undefined8 *)(pRVar18 + 0x10) = uVar4;
          *(undefined8 *)(pRVar18 + 0x18) = uVar5;
          *(undefined8 *)pRVar18 = uVar28;
          *(undefined8 *)(pRVar18 + 8) = uVar3;
          pRVar18 = dst->qtable_u;
          pRVar21 = src->qtable_u;
          uVar28 = *(undefined8 *)pRVar21;
          uVar3 = *(undefined8 *)(pRVar21 + 8);
          uVar4 = *(undefined8 *)(pRVar21 + 0x10);
          uVar5 = *(undefined8 *)(pRVar21 + 0x18);
          uVar6 = *(undefined8 *)(pRVar21 + 0x20);
          uVar7 = *(undefined8 *)(pRVar21 + 0x28);
          uVar8 = *(undefined8 *)(pRVar21 + 0x38);
          *(undefined8 *)(pRVar18 + 0x30) = *(undefined8 *)(pRVar21 + 0x30);
          *(undefined8 *)(pRVar18 + 0x38) = uVar8;
          *(undefined8 *)(pRVar18 + 0x20) = uVar6;
          *(undefined8 *)(pRVar18 + 0x28) = uVar7;
          *(undefined8 *)(pRVar18 + 0x10) = uVar4;
          *(undefined8 *)(pRVar18 + 0x18) = uVar5;
          *(undefined8 *)pRVar18 = uVar28;
          *(undefined8 *)(pRVar18 + 8) = uVar3;
          if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
            pcVar22 = strof_rc_mode(rc->rc_mode);
            _mpp_log_l(4,"jpege_api_v2","setup qtable will change mode %s fixqp",(char *)0x0,pcVar22
                      );
            goto LAB_001c7005;
          }
          goto LAB_001c723b;
        }
      }
      _mpp_log_l(2,"jpege_api_v2","invalid qtable y %p u %p v %p\n","jpege_proc_jpeg_cfg",
                 src->qtable_y,pRVar19,src->qtable_v);
      MVar27 = MPP_ERR_NULL_PTR;
    }
    else {
      uVar15 = src->q_factor;
      if (uVar15 - 100 < 0xffffff9d) {
        _mpp_log_l(2,"jpege_api_v2","q_factor out of range, default set 80\n","jpege_proc_jpeg_cfg")
        ;
        src->q_factor = 0x50;
        uVar15 = 0x50;
      }
      bVar2 = true;
      if (dst->q_factor == uVar15) {
LAB_001c717f:
        MVar27 = MPP_OK;
      }
      else {
        pRVar19 = dst->qtable_y;
        if (pRVar19 == (RK_U8 *)0x0) {
          pRVar19 = (RK_U8 *)mpp_osal_malloc("jpege_gen_qt_by_qfactor",0x40);
          dst->qtable_y = pRVar19;
        }
        pRVar20 = dst->qtable_u;
        if (pRVar20 == (RK_U8 *)0x0) {
          pRVar20 = (RK_U8 *)mpp_osal_malloc("jpege_gen_qt_by_qfactor",0x40);
          dst->qtable_u = pRVar20;
          pRVar19 = dst->qtable_y;
        }
        if (pRVar20 != (RK_U8 *)0x0 && pRVar19 != (RK_U8 *)0x0) {
          if (uVar15 < 0x32) {
            uVar15 = 5000 / (uVar15 & 0xffff);
          }
          else {
            uVar15 = uVar15 * -2 + 200;
          }
          lVar23 = 0;
          do {
            uVar24 = (uint)((ulong)("\x10\v\n\x10\x18(3=\f\f\x0e\x13\x1a:<7\x0e\r\x10\x18(9E8\x0e\x11\x16\x1d3WP>\x12\x16%8DmgM\x18#7@Qhq\\1@NWgyxeH\\_bpdgc"
                                    [lVar23] * uVar15 + 0x32) * 0x28f5c29 >> 0x20);
            if (0xfe < uVar24) {
              uVar24 = 0xff;
            }
            uVar25 = (uint)((ulong)("\x11\x12\x18/cccc\x12\x15\x1aBcccc\x18\x1a8ccccc/Bcccccccccccccccccccccccccccccccccccccc"
                                    [lVar23] * uVar15 + 0x32) * 0x28f5c29 >> 0x20);
            pRVar19[lVar23] = (char)uVar24 + (uVar24 == 0);
            if (0xfe < uVar25) {
              uVar25 = 0xff;
            }
            pRVar20[lVar23] = (char)uVar25 + (uVar25 == 0);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0x40);
          goto LAB_001c717f;
        }
        bVar2 = false;
        _mpp_log_l(2,"jpege_api_v2","qtable is null, malloc err","jpege_gen_qt_by_qfactor");
        MVar27 = MPP_ERR_MALLOC;
      }
      dst->q_factor = src->q_factor;
      iVar16 = src->qf_min;
      if (iVar16 - 100U < 0xffffff9d) {
        _mpp_log_l(2,"jpege_api_v2","qf_min out of range, default set 1\n","jpege_proc_jpeg_cfg");
        src->qf_min = 1;
        iVar16 = 1;
      }
      dst->qf_min = iVar16;
      iVar16 = src->qf_max;
      if (iVar16 - 100U < 0xffffff9d) {
        _mpp_log_l(2,"jpege_api_v2","qf_max out of range, default set 99\n","jpege_proc_jpeg_cfg");
        src->qf_max = 99;
        iVar16 = 99;
      }
      dst->qf_max = iVar16;
      if ((jpege_debug & 0x10) != 0) {
        uVar28 = CONCAT44(uVar29,iVar16);
        _mpp_log_l(4,"jpege_api_v2","q_factor %d, qf_min %d, qf_max %d\n",(char *)0x0,
                   (ulong)(uint)dst->q_factor,(ulong)(uint)dst->qf_min,uVar28);
        uVar29 = (undefined4)((ulong)uVar28 >> 0x20);
      }
      if (bVar2) goto LAB_001c723b;
    }
    _mpp_log_l(2,"jpege_api_v2","failed to accept new rc config\n","jpege_proc_jpeg_cfg");
    dst->qtable_u = pRVar21;
    dst->qtable_v = pRVar9;
    dst->qf_min = RVar10;
    *(undefined4 *)&dst->field_0x14 = uVar11;
    dst->qtable_y = pRVar18;
    dst->change = RVar17;
    dst->quant = RVar12;
    dst->q_factor = RVar13;
    dst->qf_max = RVar14;
  }
  else {
    uVar15 = src->quant;
    dst->quant = uVar15;
    if (10 < uVar15) {
      _mpp_log_l(2,"jpege_api_v2",
                 "invalid quality level %d is not in range [0..10] set to default 8\n",
                 "jpege_proc_jpeg_cfg");
      dst->quant = 8;
      uVar15 = 8;
    }
    if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
      pcVar22 = strof_rc_mode(rc->rc_mode);
      _mpp_log_l(4,"jpege_api_v2","setup quant %d change mode %s fixqp",(char *)0x0,(ulong)uVar15,
                 pcVar22);
LAB_001c7005:
      rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
    }
LAB_001c723b:
    MVar27 = MPP_OK;
    if ((jpege_debug & 0x40) != 0) {
      MVar27 = MPP_OK;
      _mpp_log_l(4,"jpege_api_v2","MPP_ENC_SET_CODEC_CFG change 0x%x jpeg quant %d q_factor %d\n",
                 (char *)0x0,(ulong)uVar1,(ulong)(uint)dst->quant,CONCAT44(uVar29,dst->q_factor));
    }
  }
  dst->change = src->change;
  return MVar27;
code_r0x001c6f7b:
  lVar23 = lVar23 + 1;
  if (lVar23 == 0x40) goto LAB_001c73e4;
  goto LAB_001c6f6d;
}

Assistant:

static MPP_RET jpege_proc_jpeg_cfg(MppEncJpegCfg *dst, MppEncJpegCfg *src, MppEncRcCfg *rc)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncJpegCfg bak = *dst;

        if (change & MPP_ENC_JPEG_CFG_CHANGE_QP) {
            dst->quant = src->quant;
            if (dst->quant < 0 || dst->quant > 10) {
                mpp_err_f("invalid quality level %d is not in range [0..10] set to default 8\n");
                dst->quant = 8;
            }

            if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
                mpp_log("setup quant %d change mode %s fixqp", dst->quant,
                        strof_rc_mode(rc->rc_mode));
                rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
            }
        } else if (change & MPP_ENC_JPEG_CFG_CHANGE_QFACTOR) {
            if (src->q_factor < 1 || src->q_factor > 99) {
                mpp_err_f("q_factor out of range, default set 80\n");
                src->q_factor = 80;
            }
            if (dst->q_factor != src->q_factor)
                ret = jpege_gen_qt_by_qfactor(dst, &src->q_factor);

            dst->q_factor = src->q_factor;
            if (src->qf_min < 1 || src->qf_min > 99) {
                mpp_err_f("qf_min out of range, default set 1\n");
                src->qf_min = 1;
            }
            dst->qf_min = src->qf_min;
            if (src->qf_max < 1 || src->qf_max > 99) {
                mpp_err_f("qf_max out of range, default set 99\n");
                src->qf_max = 99;
            }
            dst->qf_max = src->qf_max;
            jpege_dbg_input("q_factor %d, qf_min %d, qf_max %d\n",
                            dst->q_factor, dst->qf_min, dst->qf_max);
        } else if (change & MPP_ENC_JPEG_CFG_CHANGE_QTABLE) {
            if (src->qtable_y && src->qtable_u && src->qtable_v) {
                if (NULL == dst->qtable_y)
                    dst->qtable_y = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);
                if (NULL == dst->qtable_u)
                    dst->qtable_u = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);

                if (NULL == dst->qtable_y || NULL == dst->qtable_u) {
                    mpp_err_f("qtable is null, malloc err\n");
                    return MPP_ERR_MALLOC;
                }
                /* check table value */
                if (src->qtable_u != src->qtable_v) {
                    RK_U32 i;

                    for (i = 0; i < QUANTIZE_TABLE_SIZE; i++) {
                        if (src->qtable_u[i] != src->qtable_v[i]) {
                            RK_U32 j;

                            jpege_dbg_input("qtable_u and qtable_v are different, use qtable_u\n");
                            for (j = 0; j < QUANTIZE_TABLE_SIZE; j++)
                                jpege_dbg_input("qtable_u[%d] %d qtable_v[%d] %d\n",
                                                j, src->qtable_u[j], j, src->qtable_v[j]);
                            break;
                        }
                    }
                }
                /* default use one chroma qtable, select qtable_u */
                memcpy(dst->qtable_y, src->qtable_y, QUANTIZE_TABLE_SIZE);
                memcpy(dst->qtable_u, src->qtable_u, QUANTIZE_TABLE_SIZE);

                if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
                    mpp_log("setup qtable will change mode %s fixqp",
                            strof_rc_mode(rc->rc_mode));
                    rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
                }
            } else {
                mpp_err_f("invalid qtable y %p u %p v %p\n",
                          src->qtable_y, src->qtable_u, src->qtable_v);
                ret = MPP_ERR_NULL_PTR;
            }
        }

        if (ret) {
            mpp_err_f("failed to accept new rc config\n");
            *dst = bak;
        } else {
            jpege_dbg_ctrl("MPP_ENC_SET_CODEC_CFG change 0x%x jpeg quant %d q_factor %d\n",
                           change, dst->quant, dst->q_factor);
            dst->change = src->change;
        }

        dst->change = src->change;
    }

    return ret;
}